

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::DefaultPrintTo<std::vector<int,std::allocator<int>>>
               (undefined8 param_1,undefined8 param_2,ostream *param_3)

{
  bool bVar1;
  const_iterator __lhs;
  const_iterator it;
  size_t count;
  size_t kMaxCount;
  const_iterator in_stack_ffffffffffffffc8;
  long local_28;
  
  std::operator<<(param_3,'{');
  local_28 = 0;
  __lhs = std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffc8._M_current);
  do {
    in_stack_ffffffffffffffc8 =
         std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffc8._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       __lhs._M_current,
                       (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffffc8._M_current);
    if (!bVar1) {
LAB_0018255a:
      if (local_28 != 0) {
        std::operator<<(param_3,' ');
      }
      std::operator<<(param_3,'}');
      return;
    }
    if ((local_28 != 0) && (std::operator<<(param_3,','), local_28 == 0x20)) {
      std::operator<<(param_3," ...");
      goto LAB_0018255a;
    }
    std::operator<<(param_3,' ');
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd0);
    UniversalPrint<int>(__lhs._M_current,(ostream *)in_stack_ffffffffffffffc8._M_current);
    __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffd0);
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(IsContainer /* dummy */,
                    false_type /* is not a pointer */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}